

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O0

void __thiscall
crnlib::corpus_tester::print_metric_stats
          (corpus_tester *this,vector<crnlib::image_utils::error_metrics> *stats,uint num_blocks_x,
          uint param_4)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  error_metrics *this_00;
  uint *puVar4;
  uint in_EDX;
  uint val0;
  vector<crnlib::image_utils::error_metrics> *in_RSI;
  double dVar5;
  double psnr_std_dev;
  error_metrics *em;
  uint by;
  uint bx;
  uint i;
  uint num_inf;
  uint num_non_inf;
  double psnr2_total;
  double psnr_total;
  vec2I worst_loc;
  vec2I best_loc;
  error_metrics worst_metrics;
  error_metrics best_metrics;
  uint local_94;
  uint local_90;
  uint local_8c;
  double local_88;
  double local_80;
  vec<2U,_int> local_78;
  vec<2U,_int> local_70;
  error_metrics local_68;
  error_metrics local_40;
  uint local_14;
  vector<crnlib::image_utils::error_metrics> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  image_utils::error_metrics::error_metrics((error_metrics *)0x10b5a2);
  image_utils::error_metrics::error_metrics((error_metrics *)0x10b5ac);
  local_68.mPeakSNR = 1000000.0;
  vec<2U,_int>::vec(&local_70);
  vec<2U,_int>::vec(&local_78);
  utils::zero_object<crnlib::vec<2u,int>>((vec<2U,_int> *)0x10b5db);
  utils::zero_object<crnlib::vec<2u,int>>((vec<2U,_int> *)0x10b5e5);
  local_80 = 0.0;
  local_88 = 0.0;
  local_8c = 0;
  local_90 = 0;
  for (local_94 = 0; uVar2 = vector<crnlib::image_utils::error_metrics>::size(local_10),
      local_94 < uVar2; local_94 = local_94 + 1) {
    val0 = local_94 % local_14;
    uVar3 = local_94 / local_14;
    this_00 = vector<crnlib::image_utils::error_metrics>::operator[](local_10,local_94);
    if ((this_00->mPeakSNR <= 200.0 && this_00->mPeakSNR != 200.0) &&
       (bVar1 = image_utils::error_metrics::operator>(this_00,&local_40), bVar1)) {
      memcpy(&local_40,this_00,0x28);
      vec<2U,_int>::set(&local_70,val0,uVar3);
    }
    bVar1 = image_utils::error_metrics::operator<(this_00,&local_68);
    if (bVar1) {
      memcpy(&local_68,this_00,0x28);
      vec<2U,_int>::set(&local_78,val0,uVar3);
    }
    if (200.0 < this_00->mPeakSNR || this_00->mPeakSNR == 200.0) {
      local_90 = local_90 + 1;
    }
    else {
      local_80 = this_00->mPeakSNR + local_80;
      local_88 = this_00->mPeakSNR * this_00->mPeakSNR + local_88;
      local_8c = local_8c + 1;
    }
  }
  console::printf("Number of infinite PSNR blocks: %u",(ulong)local_90);
  console::printf("Number of non-infinite PSNR blocks: %u");
  if (local_8c != 0) {
    local_80 = local_80 / (double)local_8c;
    dVar5 = sqrt(local_88 / (double)local_8c - local_80 * local_80);
    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f",local_80,dVar5);
    dVar5 = local_68.mPeakSNR;
    puVar4 = (uint *)vec<2U,_int>::operator[](&local_78,0);
    uVar3 = *puVar4;
    puVar4 = (uint *)vec<2U,_int>::operator[](&local_78,1);
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i",dVar5,(ulong)uVar3,(ulong)*puVar4);
    puVar4 = (uint *)vec<2U,_int>::operator[](&local_70,0);
    uVar3 = *puVar4;
    puVar4 = (uint *)vec<2U,_int>::operator[](&local_70,1);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i",local_40.mPeakSNR,(ulong)uVar3
                    ,(ulong)*puVar4);
  }
  return;
}

Assistant:

void corpus_tester::print_metric_stats(const crnlib::vector<image_utils::error_metrics>& stats, uint num_blocks_x, uint /* num_blocks_y */) {
  image_utils::error_metrics best_metrics;
  image_utils::error_metrics worst_metrics;
  worst_metrics.mPeakSNR = 1e+6f;

  vec2I best_loc;
  vec2I worst_loc;
  utils::zero_object(best_loc);
  utils::zero_object(worst_loc);

  double psnr_total = 0.0f;
  double psnr2_total = 0.0f;
  uint num_non_inf = 0;
  uint num_inf = 0;

  for (uint i = 0; i < stats.size(); i++) {
    uint bx = i % num_blocks_x;
    uint by = i / num_blocks_x;

    const image_utils::error_metrics& em = stats[i];

    if ((em.mPeakSNR < 200.0f) && (em > best_metrics)) {
      best_metrics = em;
      best_loc.set(bx, by);
    }
    if (em < worst_metrics) {
      worst_metrics = em;
      worst_loc.set(bx, by);
    }

    if (em.mPeakSNR < 200.0f) {
      psnr_total += em.mPeakSNR;
      psnr2_total += em.mPeakSNR * em.mPeakSNR;
      num_non_inf++;
    } else {
      num_inf++;
    }
  }

  console::printf("Number of infinite PSNR blocks: %u", num_inf);
  console::printf("Number of non-infinite PSNR blocks: %u", num_non_inf);
  if (num_non_inf) {
    psnr_total /= num_non_inf;
    psnr2_total /= num_non_inf;

    double psnr_std_dev = sqrt(psnr2_total - psnr_total * psnr_total);

    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f", psnr_total, psnr_std_dev);
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i", worst_metrics.mPeakSNR, worst_loc[0], worst_loc[1]);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i", best_metrics.mPeakSNR, best_loc[0], best_loc[1]);
  }
}